

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O0

void T_AddSpawnedThing(AActor *ac)

{
  DFraggleThinker *pDVar1;
  AActor *q;
  TObjPtr<AActor> local_20;
  TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *local_18;
  TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *SpawnedThings;
  AActor *ac_local;
  
  SpawnedThings = (TArray<TObjPtr<AActor>,_TObjPtr<AActor>_> *)ac;
  pDVar1 = TObjPtr::operator_cast_to_DFraggleThinker_((TObjPtr *)&DFraggleThinker::ActiveThinker);
  if (pDVar1 != (DFraggleThinker *)0x0) {
    pDVar1 = TObjPtr<DFraggleThinker>::operator->(&DFraggleThinker::ActiveThinker);
    local_18 = &pDVar1->SpawnedThings;
    q = GC::ReadBarrier<AActor>((AActor **)&SpawnedThings);
    TObjPtr<AActor>::TObjPtr(&local_20,q);
    TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Push(&pDVar1->SpawnedThings,&local_20);
  }
  return;
}

Assistant:

void T_AddSpawnedThing(AActor * ac)
{
	if (DFraggleThinker::ActiveThinker)
	{
		TArray<TObjPtr<AActor> > &SpawnedThings = DFraggleThinker::ActiveThinker->SpawnedThings;
		SpawnedThings.Push(GC::ReadBarrier(ac));
	}
}